

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asc2log.c
# Opt level: O0

void print_usage(char *prg)

{
  undefined8 in_RDI;
  
  fprintf(_stderr,"%s - convert ASC logfile to compact CAN frame logfile.\n",in_RDI);
  fprintf(_stderr,"Usage: %s\n",in_RDI);
  fprintf(_stderr,"Options:\n");
  fprintf(_stderr,"\t-I <infile>\t(default stdin)\n");
  fprintf(_stderr,"\t-O <outfile>\t(default stdout)\n");
  fprintf(_stderr,"\t-d (disable direction information R/T)\n");
  fprintf(_stderr,"\t-v (verbose)\n");
  return;
}

Assistant:

static void print_usage(char *prg)
{
	fprintf(stderr, "%s - convert ASC logfile to compact CAN frame logfile.\n", prg);
	fprintf(stderr, "Usage: %s\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "\t-I <infile>\t(default stdin)\n");
	fprintf(stderr, "\t-O <outfile>\t(default stdout)\n");
	fprintf(stderr, "\t-d (disable direction information R/T)\n");
	fprintf(stderr, "\t-v (verbose)\n");
}